

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan_ulong.c
# Opt level: O1

uint scan_ulong(char *s,unsigned_long *u)

{
  uint uVar1;
  ulong uVar2;
  unsigned_long uVar3;
  byte bVar4;
  
  bVar4 = *s - 0x30;
  if (bVar4 < 10) {
    uVar2 = 0;
    uVar3 = 0;
    do {
      uVar3 = (ulong)bVar4 + uVar3 * 10;
      uVar1 = (int)uVar2 + 1;
      uVar2 = (ulong)uVar1;
      bVar4 = s[uVar2] - 0x30;
    } while (bVar4 < 10);
  }
  else {
    uVar3 = 0;
    uVar1 = 0;
  }
  *u = uVar3;
  return uVar1;
}

Assistant:

unsigned int scan_ulong(register const char *s,register unsigned long *u)
{
  register unsigned int pos = 0;
  register unsigned long result = 0;
  register unsigned long c;
  while ((c = (unsigned long) (unsigned char) (s[pos] - '0')) < 10) {
    result = result * 10 + c;
    ++pos;
  }
  *u = result;
  return pos;
}